

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest11::iterate(FunctionalTest11 *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  ulong uVar4;
  TestContext *this_02;
  TestLog *this_03;
  MessageBuilder *pMVar5;
  socklen_t sVar6;
  GLchar *pGVar7;
  sockaddr *__addr;
  sockaddr *__addr_00;
  MessageBuilder local_258;
  uint local_d4;
  byte local_cd;
  GLuint i_1;
  uint uStack_c8;
  bool result;
  GLuint i;
  GLuint uniform;
  GLuint type;
  vertexArray vao;
  texture red_texture;
  program program;
  framebuffer framebuffer;
  texture color_texture;
  texture blue_texture;
  string local_40;
  FunctionalTest11 *local_10;
  FunctionalTest11 *this_local;
  
  local_10 = this;
  if (iterate()::test_configurations == '\0') {
    iVar2 = __cxa_guard_acquire(&iterate()::test_configurations);
    if (iVar2 != 0) {
      testConfiguration::testConfiguration
                (iterate::test_configurations,"Expect red color from 1st sampler",iterate::red_color
                 ,1,0,0,0,0,1,0);
      testConfiguration::testConfiguration
                (iterate::test_configurations + 1,
                 "Test \"without discard\" option, expect no blue color from 2nd sampler","",0,1,1,1
                 ,1,0,1);
      testConfiguration::testConfiguration
                (iterate::test_configurations + 2,"Fragment shoud be discarded","",0,0,0,0,0,1,0);
      testConfiguration::testConfiguration
                (iterate::test_configurations + 3,"Expect blue color from 1st sampler","",1,1,0,0,0,
                 0,1);
      testConfiguration::testConfiguration
                (iterate::test_configurations + 4,"Expect red color from 2nd sampler",
                 iterate::red_color,1,0,1,0,0,0,1);
      testConfiguration::testConfiguration
                (iterate::test_configurations + 5,"Expect no blue color from 2nd sampler","",1,1,1,1
                 ,0,0,1);
      __cxa_guard_release(&iterate()::test_configurations);
    }
  }
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    blue_texture.m_context._6_1_ = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_ARB_shader_subroutine is not supported.",
               (allocator<char> *)((long)&blue_texture.m_context + 7));
    tcu::NotSupportedError::NotSupportedError(this_01,&local_40);
    blue_texture.m_context._6_1_ = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  Utils::texture::texture((texture *)&color_texture.m_context,(this->super_TestCase).m_context);
  Utils::texture::texture((texture *)&framebuffer.m_context,(this->super_TestCase).m_context);
  Utils::framebuffer::framebuffer
            ((framebuffer *)&program.m_context,(this->super_TestCase).m_context);
  Utils::program::program((program *)&red_texture.m_context,(this->super_TestCase).m_context);
  Utils::texture::texture((texture *)&vao.m_context,(this->super_TestCase).m_context);
  Utils::vertexArray::vertexArray((vertexArray *)&uniform,(this->super_TestCase).m_context);
  iVar2 = 0;
  pGVar7 = iterate::geometry_shader_code;
  Utils::program::build
            ((program *)&red_texture.m_context,(GLchar *)0x0,iterate::fragment_shader_code,
             iterate::geometry_shader_code,(GLchar *)0x0,(GLchar *)0x0,iterate::vertex_shader_code,
             (GLchar **)0x0,0,false);
  sVar6 = (socklen_t)pGVar7;
  Utils::program::use((program *)&red_texture.m_context);
  Utils::vertexArray::generate((vertexArray *)&uniform);
  Utils::vertexArray::bind((vertexArray *)&uniform,iVar2,__addr,sVar6);
  Utils::texture::create((texture *)&color_texture.m_context,0x20,0x20,0x8058);
  Utils::texture::create((texture *)&framebuffer.m_context,0x20,0x20,0x8058);
  sVar6 = 0x8058;
  iVar2 = 0x20;
  Utils::texture::create((texture *)&vao.m_context,0x20,0x20,0x8058);
  Utils::framebuffer::generate((framebuffer *)&program.m_context);
  Utils::framebuffer::bind((framebuffer *)&program.m_context,iVar2,__addr_00,sVar6);
  Utils::framebuffer::attachTexture
            ((framebuffer *)&program.m_context,0x8ce0,(GLuint)framebuffer.m_context,0x20,0x20);
  for (i = 0; i < 5; i = i + 1) {
    GVar3 = Utils::program::getSubroutineIndex
                      ((program *)&red_texture.m_context,iterate::subroutine_names[i][0],0x8b30);
    this->m_subroutine_indices[i][0] = GVar3;
    GVar3 = Utils::program::getSubroutineIndex
                      ((program *)&red_texture.m_context,iterate::subroutine_names[i][1],0x8b30);
    this->m_subroutine_indices[i][1] = GVar3;
  }
  for (uStack_c8 = 0; uStack_c8 < 5; uStack_c8 = uStack_c8 + 1) {
    GVar3 = Utils::program::getSubroutineUniformLocation
                      ((program *)&red_texture.m_context,
                       iterate::subroutine_uniform_names[uStack_c8],0x8b30);
    this->m_subroutine_uniform_locations[uStack_c8] = GVar3;
  }
  for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
    GVar3 = Utils::program::getUniformLocation
                      ((program *)&red_texture.m_context,iterate::uniform_names[i_1]);
    this->m_uniform_locations[i_1] = GVar3;
  }
  fillTexture(this,(texture *)&color_texture.m_context,"");
  fillTexture(this,(texture *)&framebuffer.m_context,"");
  fillTexture(this,(texture *)&vao.m_context,iterate::red_color);
  this->m_source_textures[0] = (GLuint)color_texture.m_context;
  this->m_source_textures[1] = (GLuint)vao.m_context;
  Utils::framebuffer::clearColor((framebuffer *)&program.m_context,0.0,0.0,0.0,0.0);
  local_cd = 1;
  for (local_d4 = 0; local_d4 < 6; local_d4 = local_d4 + 1) {
    Utils::framebuffer::clear((framebuffer *)&program.m_context,0x4000);
    uVar4 = (ulong)local_d4;
    bVar1 = testDraw(this,iterate::test_configurations[uVar4].m_routines,
                     iterate::test_configurations[uVar4].m_samplers,
                     iterate::test_configurations[uVar4].m_expected_color,
                     (texture *)&framebuffer.m_context);
    if (!bVar1) {
      this_02 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      this_03 = tcu::TestContext::getLog(this_02);
      tcu::TestLog::operator<<(&local_258,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_258,(char (*) [35])"Error. Failure for configuration: ");
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,&iterate::test_configurations[local_d4].m_description);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_258);
      local_cd = 0;
    }
  }
  if ((local_cd & 1) == 1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  Utils::vertexArray::~vertexArray((vertexArray *)&uniform);
  Utils::texture::~texture((texture *)&vao.m_context);
  Utils::program::~program((program *)&red_texture.m_context);
  Utils::framebuffer::~framebuffer((framebuffer *)&program.m_context);
  Utils::texture::~texture((texture *)&framebuffer.m_context);
  Utils::texture::~texture((texture *)&color_texture.m_context);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest11::iterate()
{
	static const GLchar* fragment_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"// Output\n"
		"layout(location = 0) out vec4 out_color;\n"
		"\n"
		"// Global variables\n"
		"vec4 success_color;\n"
		"vec4 failure_color;\n"
		"\n"
		"// Samplers\n"
		"uniform sampler2D sampler_1;\n"
		"uniform sampler2D sampler_2;\n"
		"\n"
		"// Functions\n"
		"bool are_same(in vec4 left, in vec4 right)\n"
		"{\n"
		"    bvec4 result;\n"
		"\n"
		"    result.x = (left.x == right.x);\n"
		"    result.y = (left.y == right.y);\n"
		"    result.z = (left.z == right.z);\n"
		"    result.w = (left.w == right.w);\n"
		"\n"
		"    return all(result);\n"
		"}\n"
		"\n"
		"bool are_different(in vec4 left, in vec4 right)\n"
		"{\n"
		"    bvec4 result;\n"
		"\n"
		"    result.x = (left.x != right.x);\n"
		"    result.y = (left.y != right.y);\n"
		"    result.z = (left.z != right.z);\n"
		"    result.w = (left.w != right.w);\n"
		"\n"
		"    return any(result);\n"
		"}\n"
		"\n"
		"// Subroutine types\n"
		"subroutine void discard_fragment_type(void);\n"
		"subroutine void set_global_colors_type(void);\n"
		"subroutine vec4 sample_texture_type(in vec2);\n"
		"subroutine bool comparison_type(in vec4 left, in vec4 right);\n"
		"subroutine void test_type(void);\n"
		"\n"
		"// Subroutine definitions\n"
		"// discard_fragment_type\n"
		"subroutine(discard_fragment_type) void discard_yes(void)\n"
		"{\n"
		"    discard;\n"
		"}\n"
		"\n"
		"subroutine(discard_fragment_type) void discard_no(void)\n"
		"{\n"
		"}\n"
		"\n"
		"// set_global_colors_type\n"
		"subroutine(set_global_colors_type) void red_pass_blue_fail(void)\n"
		"{\n"
		"    success_color = vec4(1, 0, 0, 1);\n"
		"    failure_color = vec4(0, 0, 1, 1);\n"
		"}\n"
		"\n"
		"subroutine(set_global_colors_type) void blue_pass_red_fail(void)\n"
		"{\n"
		"    success_color = vec4(0, 0, 1, 1);\n"
		"    failure_color = vec4(1, 0, 0, 1);\n"
		"}\n"
		"\n"
		"// sample_texture_type\n"
		"subroutine(sample_texture_type) vec4 first_sampler(in vec2 coord)\n"
		"{\n"
		"    return texture(sampler_1, coord);\n"
		"}\n"
		"\n"
		"subroutine(sample_texture_type) vec4 second_sampler(in vec2 coord)\n"
		"{\n"
		"    return texture(sampler_2, coord);\n"
		"}\n"
		"\n"
		"// comparison_type\n"
		"subroutine(comparison_type) bool check_equal(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return are_same(left, right);\n"
		"}\n"
		"\n"
		"subroutine(comparison_type) bool check_not_equal(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return are_different(left, right);\n"
		"}\n"
		"\n"
		"// Subroutine uniforms\n"
		"subroutine uniform discard_fragment_type  discard_fragment;\n"
		"subroutine uniform set_global_colors_type set_global_colors;\n"
		"subroutine uniform sample_texture_type    sample_texture;\n"
		"subroutine uniform comparison_type        compare;\n"
		"\n"
		"// Subroutine definitions\n"
		"// test_type\n"
		"subroutine(test_type) void test_with_discard(void)\n"
		"{\n"
		"    discard_fragment();"
		"\n"
		"    out_color = failure_color;\n"
		"\n"
		"    set_global_colors();\n"
		"\n"
		"    vec4 sampled_color = sample_texture(gl_PointCoord);\n"
		"\n"
		"    bool comparison_result = compare(success_color, sampled_color);\n"
		"\n"
		"    if (true == comparison_result)\n"
		"    {\n"
		"        out_color = success_color;\n"
		"    }\n"
		"    else\n"
		"    {\n"
		"        out_color = failure_color;\n"
		"    }\n"
		"}\n"
		"\n"
		"subroutine(test_type) void test_without_discard(void)\n"
		"{\n"
		"    set_global_colors();\n"
		"\n"
		"    vec4 sampled_color = sample_texture(gl_PointCoord);\n"
		"\n"
		"    bool comparison_result = compare(success_color, sampled_color);\n"
		"\n"
		"    if (true == comparison_result)\n"
		"    {\n"
		"        out_color = success_color;\n"
		"    }\n"
		"    else\n"
		"    {\n"
		"        out_color = failure_color;\n"
		"    }\n"
		"}\n"
		"\n"
		"// Subroutine uniforms\n"
		"subroutine uniform test_type test;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    // Set colors\n"
		"    success_color = vec4(0.5, 0.5, 0.5, 0.5);\n"
		"    failure_color = vec4(0.5, 0.5, 0.5, 0.5);\n"
		"\n"
		"    test();\n"
		"}\n"
		"\n";

	static const GLchar* geometry_shader_code = "#version 400 core\n"
												"#extension GL_ARB_shader_subroutine : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"layout(points)                           in;\n"
												"layout(triangle_strip, max_vertices = 4) out;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    gl_Position = vec4(-1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4(-1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    EndPrimitive();\n"
												"}\n"
												"\n";

	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "}\n"
											  "\n";

	static const GLchar* subroutine_names[][2] = { { "discard_yes", "discard_no" },
												   { "red_pass_blue_fail", "blue_pass_red_fail" },
												   { "first_sampler", "second_sampler" },
												   { "check_equal", "check_not_equal" },
												   { "test_with_discard", "test_without_discard" } };
	static const GLuint n_subroutine_types = sizeof(subroutine_names) / sizeof(subroutine_names[0]);

	static const GLchar* subroutine_uniform_names[] = { "discard_fragment", "set_global_colors", "sample_texture",
														"compare", "test" };
	static const GLuint n_subroutine_uniform_names =
		sizeof(subroutine_uniform_names) / sizeof(subroutine_uniform_names[0]);

	static const GLchar* uniform_names[] = {
		"sampler_1", "sampler_2",
	};
	static const GLuint n_uniform_names = sizeof(uniform_names) / sizeof(uniform_names[0]);

	/* Colors */
	static const GLubyte blue_color[4]  = { 0, 0, 255, 255 };
	static const GLubyte clean_color[4] = { 0, 0, 0, 0 };
	static const GLubyte red_color[4]   = { 255, 0, 0, 255 };

	/* Configurations */
	static const testConfiguration test_configurations[] = {
		testConfiguration(
			"Expect red color from 1st sampler", red_color, 1 /* discard_fragment  : discard_no         */,
			0 /* set_global_colors : red_pass_blue_fail */, 0 /* sample_texture    : first_sampler      */,
			0 /* compare           : check_equal        */, 0 /* test              : test_with_discard  */, 1 /* red */,
			0 /* blue */),

		testConfiguration(
			"Test \"without discard\" option, expect no blue color from 2nd sampler", blue_color,
			0 /* discard_fragment  : discard_yes           */, 1 /* set_global_colors : blue_pass_red_fail    */,
			1 /* sample_texture    : second_sampler        */, 1 /* compare           : check_not_equal       */,
			1 /* test              : test_without_discard  */, 0 /* blue */, 1 /* red */),

		testConfiguration("Fragment shoud be discarded", clean_color, 0 /* discard_fragment  : discard_yes        */,
						  0 /* set_global_colors : red_pass_blue_fail */,
						  0 /* sample_texture    : first_sampler      */,
						  0 /* compare           : check_equal        */,
						  0 /* test              : test_with_discard  */, 1 /* red */, 0 /* blue */),

		testConfiguration(
			"Expect blue color from 1st sampler", blue_color, 1 /* discard_fragment  : discard_no         */,
			1 /* set_global_colors : blue_pass_red_fail */, 0 /* sample_texture    : first_sampler      */,
			0 /* compare           : check_equal        */, 0 /* test              : test_with_discard  */,
			0 /* blue */, 1 /* red */),

		testConfiguration(
			"Expect red color from 2nd sampler", red_color, 1 /* discard_fragment  : discard_no         */,
			0 /* set_global_colors : red_pass_blue_fail */, 1 /* sample_texture    : second_sampler     */,
			0 /* compare           : check_equal        */, 0 /* test              : test_with_discard  */,
			0 /* blue */, 1 /* red */),

		testConfiguration(
			"Expect no blue color from 2nd sampler", blue_color, 1 /* discard_fragment  : discard_no         */,
			1 /* set_global_colors : blue_pass_red_fail */, 1 /* sample_texture    : second_sampler     */,
			1 /* compare           : check_not_equal    */, 0 /* test              : test_with_discard  */,
			0 /* blue */, 1 /* red */),
	};
	static const GLuint n_test_cases = sizeof(test_configurations) / sizeof(test_configurations[0]);

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* GL objects */
	Utils::texture	 blue_texture(m_context);
	Utils::texture	 color_texture(m_context);
	Utils::framebuffer framebuffer(m_context);
	Utils::program	 program(m_context);
	Utils::texture	 red_texture(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, fragment_shader_code /* fs */, geometry_shader_code /* gs */, 0 /* tcs */, 0 /* test */,
				  vertex_shader_code, 0 /* varying_names */, 0 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	blue_texture.create(m_texture_width, m_texture_height, GL_RGBA8);
	color_texture.create(m_texture_width, m_texture_height, GL_RGBA8);
	red_texture.create(m_texture_width, m_texture_height, GL_RGBA8);

	framebuffer.generate();
	framebuffer.bind();
	framebuffer.attachTexture(GL_COLOR_ATTACHMENT0, color_texture.m_id, m_texture_width, m_texture_height);

	/* Get subroutine indices */
	for (GLuint type = 0; type < n_subroutine_types; ++type)
	{
		m_subroutine_indices[type][0] = program.getSubroutineIndex(subroutine_names[type][0], GL_FRAGMENT_SHADER);
		m_subroutine_indices[type][1] = program.getSubroutineIndex(subroutine_names[type][1], GL_FRAGMENT_SHADER);
	}

	/* Get subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
	{
		m_subroutine_uniform_locations[uniform] =
			program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_FRAGMENT_SHADER);
	}

	/* Get uniform locations */
	for (GLuint i = 0; i < n_uniform_names; ++i)
	{
		m_uniform_locations[i] = program.getUniformLocation(uniform_names[i]);
	}

	/* Prepare textures */
	fillTexture(blue_texture, blue_color);
	fillTexture(color_texture, clean_color);
	fillTexture(red_texture, red_color);

	m_source_textures[0] = blue_texture.m_id;
	m_source_textures[1] = red_texture.m_id;

	framebuffer.clearColor(0.0f, 0.0f, 0.0f, 0.0f);

	/* Test */
	bool result = true;
	for (GLuint i = 0; i < n_test_cases; ++i)
	{
		/* Clean output texture */
		framebuffer.clear(GL_COLOR_BUFFER_BIT);

		/* Execute test */
		if (false == testDraw(test_configurations[i].m_routines, test_configurations[i].m_samplers,
							  test_configurations[i].m_expected_color, color_texture))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Error. Failure for configuration: " << test_configurations[i].m_description
				<< tcu::TestLog::EndMessage;

			result = false;
		}
	}

	/* Set result */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}